

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<capnp::JsonCodec::HandlerBase_*const_&> __thiscall
kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
find<capnp::StructSchema::Field&>
          (HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *this,Field *key)

{
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<const_kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry_&>
  local_28;
  Field *local_20;
  Field *key_local;
  HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*> *this_local;
  
  local_20 = key;
  key_local = (Field *)this;
  local_28 = Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
             ::find<0ul,capnp::StructSchema::Field&>
                       ((Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<const_kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry_&>
          ::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_map_h:363:30)>
                    (&local_28,&local_29);
  return (Maybe<capnp::JsonCodec::HandlerBase_*const_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Value&> HashMap<Key, Value>::find(KeyLike&& key) const {
  return table.find(key).map([](const Entry& e) -> const Value& { return e.value; });
}